

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PushClipRect
          (ImDrawList *this,ImVec2 cr_min,ImVec2 cr_max,bool intersect_with_current_clip_rect)

{
  undefined4 uVar1;
  ulong uVar2;
  undefined4 uVar3;
  ImVec4 *__src;
  ImVec4 IVar4;
  uint uVar5;
  int iVar6;
  ImVec4 *__dest;
  int iVar7;
  int iVar8;
  undefined7 in_register_00000031;
  undefined1 in_register_00001208 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar9 [16];
  
  auVar12._8_56_ = in_register_00001248;
  auVar12._0_8_ = cr_max;
  auVar11 = auVar12._0_16_;
  auVar10._8_56_ = in_register_00001208;
  auVar10._0_8_ = cr_min;
  auVar9 = auVar10._0_16_;
  if ((int)CONCAT71(in_register_00000031,intersect_with_current_clip_rect) != 0) {
    uVar2._0_4_ = (this->_CmdHeader).ClipRect.z;
    uVar2._4_4_ = (this->_CmdHeader).ClipRect.w;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar2;
    auVar14 = vcmpps_avx(auVar13,auVar11,1);
    auVar14 = vshufps_avx(auVar14,auVar14,0x50);
    uVar5 = vmovmskpd_avx(auVar14);
    if ((uVar5 & 1) == 0) {
      auVar13 = auVar11;
    }
    uVar1 = (this->_CmdHeader).ClipRect.x;
    uVar3 = (this->_CmdHeader).ClipRect.y;
    auVar14._4_4_ = uVar3;
    auVar14._0_4_ = uVar1;
    auVar14._8_8_ = 0;
    if ((uVar5 & 2) == 0) {
      auVar11._4_12_ = auVar12._4_12_;
      auVar11._0_4_ = auVar13._0_4_;
    }
    else {
      auVar11._4_4_ = uVar2._4_4_;
      auVar11._0_4_ = auVar13._0_4_;
      auVar11._8_8_ = 0;
    }
    auVar9 = vmaxps_avx(auVar14,auVar9);
  }
  iVar6 = (this->_ClipRectStack).Size;
  if (iVar6 == (this->_ClipRectStack).Capacity) {
    if (iVar6 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar6 / 2 + iVar6;
    }
    iVar8 = iVar6 + 1;
    if (iVar6 + 1 < iVar7) {
      iVar8 = iVar7;
    }
    __dest = (ImVec4 *)ImGui::MemAlloc((long)iVar8 << 4);
    __src = (this->_ClipRectStack).Data;
    if (__src != (ImVec4 *)0x0) {
      memcpy(__dest,__src,(long)(this->_ClipRectStack).Size << 4);
      ImGui::MemFree((this->_ClipRectStack).Data);
    }
    (this->_ClipRectStack).Data = __dest;
    (this->_ClipRectStack).Capacity = iVar8;
    iVar6 = (this->_ClipRectStack).Size;
  }
  else {
    __dest = (this->_ClipRectStack).Data;
  }
  auVar14 = vcmpps_avx(auVar11,auVar9,2);
  auVar11 = vblendvps_avx(auVar11,auVar9,auVar14);
  IVar4 = (ImVec4)vmovlhps_avx(auVar9,auVar11);
  __dest[iVar6] = IVar4;
  (this->_ClipRectStack).Size = (this->_ClipRectStack).Size + 1;
  (this->_CmdHeader).ClipRect = IVar4;
  _OnChangedClipRect(this);
  return;
}

Assistant:

void ImDrawList::PushClipRect(ImVec2 cr_min, ImVec2 cr_max, bool intersect_with_current_clip_rect)
{
    ImVec4 cr(cr_min.x, cr_min.y, cr_max.x, cr_max.y);
    if (intersect_with_current_clip_rect)
    {
        ImVec4 current = _CmdHeader.ClipRect;
        if (cr.x < current.x) cr.x = current.x;
        if (cr.y < current.y) cr.y = current.y;
        if (cr.z > current.z) cr.z = current.z;
        if (cr.w > current.w) cr.w = current.w;
    }
    cr.z = ImMax(cr.x, cr.z);
    cr.w = ImMax(cr.y, cr.w);

    _ClipRectStack.push_back(cr);
    _CmdHeader.ClipRect = cr;
    _OnChangedClipRect();
}